

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool __thiscall
ON_RTree::InsertRect
          (ON_RTree *this,ON_RTreeBBox *a_rect,ON__INT_PTR a_id,ON_RTreeNode **a_root,int a_level)

{
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 a_node;
  bool bVar1;
  ON_RTreeNode *a_node_00;
  ON_RTreeNode *newNode;
  ON_RTreeNode *local_70;
  ON_RTreeBranch local_68;
  
  bVar1 = InsertRectRec(this,a_rect,a_id,*a_root,&local_70,a_level);
  if (bVar1) {
    a_node_00 = ON_RTreeMemPool::AllocNode(&this->m_mem_pool);
    a_node.m_child = *a_root;
    a_node_00->m_level = (a_node.m_child)->m_level + 1;
    NodeCover(&local_68.m_rect,a_node.m_child);
    local_68.field_1.m_child = a_node.m_child;
    AddBranch(this,&local_68,a_node_00,(ON_RTreeNode **)0x0);
    NodeCover(&local_68.m_rect,local_70);
    local_68.field_1.m_child = local_70;
    AddBranch(this,&local_68,a_node_00,(ON_RTreeNode **)0x0);
    *a_root = a_node_00;
  }
  return bVar1;
}

Assistant:

bool ON_RTree::InsertRect(ON_RTreeBBox* a_rect, ON__INT_PTR a_id, ON_RTreeNode** a_root, int a_level)
{
  ON_RTreeNode* newRoot;
  ON_RTreeNode* newNode;
  ON_RTreeBranch branch;

  if(InsertRectRec(a_rect, a_id, *a_root, &newNode, a_level))  // Root split
  {
    newRoot = m_mem_pool.AllocNode();  // Grow tree taller and new root
    newRoot->m_level = (*a_root)->m_level + 1;
    branch.m_rect = NodeCover(*a_root);
    branch.m_child = *a_root;
    AddBranch(&branch, newRoot, nullptr);
    branch.m_rect = NodeCover(newNode);
    branch.m_child = newNode;
    AddBranch(&branch, newRoot, nullptr);
    *a_root = newRoot;
    return true;
  }

  return false;
}